

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

void init_macrodis(void)

{
  int iVar1;
  
  if (mcr_parm != (char *)0x0) {
    return;
  }
  iVar1 = asprintf(&mcr_parm,"%sparm%s",colors->rname,colors->reset);
  if (((((((((-1 < iVar1) &&
            (iVar1 = asprintf(&mcr_mov,"%smov%s",colors->rname,colors->reset), -1 < iVar1)) &&
           (iVar1 = asprintf(&mcr_maddr,"%smaddr%s",colors->rname,colors->reset), -1 < iVar1)) &&
          ((iVar1 = asprintf(&mcr_send,"%ssend%s",colors->rname,colors->reset), -1 < iVar1 &&
           (iVar1 = asprintf(&mcr_exit,"%sexit%s ",colors->rname,colors->reset), -1 < iVar1)))) &&
         (iVar1 = asprintf(&mcr_add,"%sadd%s",colors->rname,colors->reset), -1 < iVar1)) &&
        (((iVar1 = asprintf(&mcr_adc,"%sadc%s",colors->rname,colors->reset), -1 < iVar1 &&
          (iVar1 = asprintf(&mcr_sub,"%ssub%s",colors->rname,colors->reset), -1 < iVar1)) &&
         ((iVar1 = asprintf(&mcr_sbb,"%ssbb%s",colors->rname,colors->reset), -1 < iVar1 &&
          (((iVar1 = asprintf(&mcr_and,"%sand%s",colors->rname,colors->reset), -1 < iVar1 &&
            (iVar1 = asprintf(&mcr_andn,"%sandn%s",colors->rname,colors->reset), -1 < iVar1)) &&
           (iVar1 = asprintf(&mcr_nand,"%snand%s",colors->rname,colors->reset), -1 < iVar1))))))))
       && ((iVar1 = asprintf(&mcr_or,"%sor%s",colors->rname,colors->reset), -1 < iVar1 &&
           (iVar1 = asprintf(&mcr_xor,"%sxor%s",colors->rname,colors->reset), -1 < iVar1)))) &&
      (((iVar1 = asprintf(&mcr_read,"%sread%s",colors->rname,colors->reset), -1 < iVar1 &&
        (((iVar1 = asprintf(&mcr_bra,"%sbra%s",colors->rname,colors->reset), -1 < iVar1 &&
          (iVar1 = asprintf(&mcr_braz,"%sbraz%s",colors->rname,colors->reset), -1 < iVar1)) &&
         ((iVar1 = asprintf(&mcr_branz,"%sbranz%s",colors->rname,colors->reset), -1 < iVar1 &&
          (((iVar1 = asprintf(&mcr_mthd,"%smthd%s",colors->reg,colors->reset), -1 < iVar1 &&
            (iVar1 = asprintf(&mcr_incr,"%sincr%s",colors->reg,colors->reset), -1 < iVar1)) &&
           (iVar1 = asprintf(&mcr_nop,"%snop%s",colors->rname,colors->reset), -1 < iVar1)))))))) &&
       (((iVar1 = asprintf(&mcr_annul," %sannul%s",colors->mod,colors->reset), -1 < iVar1 &&
         (iVar1 = asprintf(&mcr_extrshl,"%sextrshl%s",colors->rname,colors->reset), -1 < iVar1)) &&
        (iVar1 = asprintf(&mcr_extrinsrt,"%sextrinsrt%s",colors->rname,colors->reset), -1 < iVar1)))
       ))) && ((iVar1 = asprintf(&mcr_parmsend,"%sparmsend%s",colors->rname,colors->reset),
               -1 < iVar1 &&
               (iVar1 = asprintf(&mcr_maddrsend,"%smaddrsend%s",colors->rname,colors->reset),
               -1 < iVar1)))) {
    return;
  }
  demmt_abort();
}

Assistant:

static void init_macrodis()
{
	if (mcr_parm)
		return;
	if (asprintf(&mcr_parm,  "%sparm%s",  colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_mov,   "%smov%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_maddr, "%smaddr%s", colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_send,  "%ssend%s",  colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_exit,  "%sexit%s ", colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_add,   "%sadd%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_adc,   "%sadc%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_sub,   "%ssub%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_sbb,   "%ssbb%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_and,   "%sand%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_andn,  "%sandn%s",  colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_nand,  "%snand%s",  colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_or,    "%sor%s",    colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_xor,   "%sxor%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_read,  "%sread%s",  colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_bra,   "%sbra%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_braz,  "%sbraz%s",  colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_branz, "%sbranz%s", colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_mthd,  "%smthd%s",  colors->reg,   colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_incr,  "%sincr%s",  colors->reg,   colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_nop,   "%snop%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_annul, " %sannul%s",colors->mod,   colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_extrshl,   "%sextrshl%s",   colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_extrinsrt, "%sextrinsrt%s", colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_parmsend,  "%sparmsend%s",  colors->rname, colors->reset) < 0) demmt_abort();
	if (asprintf(&mcr_maddrsend, "%smaddrsend%s", colors->rname, colors->reset) < 0) demmt_abort();
}